

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test::
TestBody(ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test *this)

{
  bool bVar1;
  EnumDescriptor *descriptor;
  RepeatedPtrField<google::protobuf::Option> *pRVar2;
  char *message;
  EnumValue *this_00;
  char *pcVar3;
  char *in_R9;
  string_view name;
  string local_1a0;
  AssertHelper local_180;
  Message local_178;
  string_view local_170;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__1;
  size_t local_f8;
  EnumValue *value;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  string_view local_b0 [2];
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  Enum type;
  ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test *this_local;
  
  descriptor = proto2_unittest::TestMessageWithCustomOptions::AnEnum_descriptor();
  ConvertDescriptorToType((Enum *)&gtest_ar_.message_,descriptor);
  pRVar2 = Enum::options((Enum *)&gtest_ar_.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_b0,"proto2_unittest.enum_opt1");
  pcVar3 = (char *)0xfffffceb;
  local_89 = HasInt32Option(pRVar2,local_b0[0],-0x315);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_88,
               (AssertionResult *)
               "HasInt32Option(type.options(), \"proto2_unittest.enum_opt1\", -789)","false","true",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)0x2ef;
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2ef,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,
               "ANENUM_VAL2");
    name._M_str = pcVar3;
    name._M_len = local_f8;
    this_00 = FindEnumValue((anon_unknown_0 *)&gtest_ar_.message_,
                            (Enum *)gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl,name);
    local_111 = this_00 != (EnumValue *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_110,&local_111,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_110,(AssertionResult *)0x1dcf74a,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x2f1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    if (bVar1) {
      pRVar2 = EnumValue::options(this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_170,"proto2_unittest.enum_value_opt1");
      local_159 = HasInt32Option(pRVar2,local_170,0x7b);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_158,&local_159,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1a0,(internal *)local_158,
                   (AssertionResult *)
                   "HasInt32Option(value->options(), \"proto2_unittest.enum_value_opt1\", 123)",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                   ,0x2f3,pcVar3);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        testing::Message::~Message(&local_178);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    }
  }
  Enum::~Enum((Enum *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestCustomEnumOptions) {
  Enum type = ConvertDescriptorToType(
      *proto2_unittest::TestMessageWithCustomOptions::AnEnum_descriptor());
  ASSERT_TRUE(
      HasInt32Option(type.options(), "proto2_unittest.enum_opt1", -789));
  const EnumValue* value = FindEnumValue(type, "ANENUM_VAL2");
  ASSERT_TRUE(value != nullptr);
  ASSERT_TRUE(
      HasInt32Option(value->options(), "proto2_unittest.enum_value_opt1", 123));
}